

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_stream.c
# Opt level: O2

_Bool al_set_audio_stream_fragment(ALLEGRO_AUDIO_STREAM *stream,void *val)

{
  uint uVar1;
  ALLEGRO_MUTEX *mutex;
  ulong uVar2;
  
  mutex = (stream->spl).mutex;
  maybe_lock_mutex(mutex);
  uVar1 = stream->buf_count;
  uVar2 = 0;
  do {
    if (uVar1 == uVar2) {
      _al_set_error(2,"Attempted to set a stream buffer with a full pending list");
LAB_0010c082:
      maybe_unlock_mutex(mutex);
      return uVar2 < uVar1;
    }
    if (stream->pending_bufs[uVar2] == (void *)0x0) {
      stream->pending_bufs[uVar2] = val;
      goto LAB_0010c082;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool al_set_audio_stream_fragment(ALLEGRO_AUDIO_STREAM *stream, void *val)
{
   size_t i;
   bool ret;
   ALLEGRO_MUTEX *stream_mutex;
   ASSERT(stream);

   stream_mutex = maybe_lock_mutex(stream->spl.mutex);

   for (i = 0; i < stream->buf_count && stream->pending_bufs[i] ; i++)
      ;
   if (i < stream->buf_count) {
      stream->pending_bufs[i] = val;
      ret = true;
   }
   else {
      _al_set_error(ALLEGRO_INVALID_OBJECT,
         "Attempted to set a stream buffer with a full pending list");
      ret = false;
   }

   maybe_unlock_mutex(stream_mutex);

   return ret;
}